

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

TemplateTokenVector * __thiscall minja::Parser::tokenize(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  reference pvVar4;
  runtime_error *prVar5;
  long in_RSI;
  TemplateTokenVector *in_RDI;
  exception *e;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  text_end;
  SpaceHandling post_space_16;
  SpaceHandling post_space_15;
  SpaceHandling post_space_14;
  shared_ptr<minja::Expression> filter;
  SpaceHandling post_space_13;
  SpaceHandling post_space_12;
  Parameters params;
  shared_ptr<minja::VariableExpr> macroname;
  SpaceHandling post_space_11;
  SpaceHandling post_space_10;
  shared_ptr<minja::Expression> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  string ns;
  SpaceHandling post_space_9;
  SpaceHandling post_space_8;
  SpaceHandling post_space_7;
  SpaceHandling post_space_6;
  bool recursive;
  shared_ptr<minja::Expression> condition_2;
  shared_ptr<minja::Expression> iterable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varnames;
  SpaceHandling post_space_5;
  SpaceHandling post_space_4;
  SpaceHandling post_space_3;
  shared_ptr<minja::Expression> condition_1;
  SpaceHandling post_space_2;
  shared_ptr<minja::Expression> condition;
  anon_class_16_2_ee9a8eb6 parseBlockClose;
  string keyword;
  SpaceHandling pre_space_2;
  SpaceHandling post_space_1;
  shared_ptr<minja::Expression> expr;
  SpaceHandling pre_space_1;
  SpaceHandling post_space;
  value_type content;
  SpaceHandling pre_space;
  Location location;
  smatch match;
  string text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  group;
  TemplateTokenVector *tokens;
  Parser *in_stack_fffffffffffff6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  value_type *in_stack_fffffffffffff6c8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff6d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6f0;
  Location *in_stack_fffffffffffff6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  Parser *in_stack_fffffffffffff708;
  Parser *in_stack_fffffffffffff718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  allocator<char> *in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff748;
  undefined7 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff757;
  Parser *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  SpaceHandling in_stack_fffffffffffff76c;
  regex *in_stack_fffffffffffff770;
  Parser *in_stack_fffffffffffff778;
  SpaceHandling in_stack_fffffffffffff784;
  Parser *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff928;
  byte in_stack_fffffffffffff92f;
  Parser *in_stack_fffffffffffff968;
  undefined1 local_628 [15];
  undefined1 local_619 [49];
  undefined4 local_5e8;
  undefined4 local_5e4;
  allocator<char> local_5c9;
  char *local_5c8;
  undefined8 local_5c0;
  Parser local_5b8;
  undefined8 local_588;
  undefined1 local_579;
  string local_578 [36];
  uint local_554;
  undefined1 local_548 [36];
  SpaceHandling local_524;
  SpaceHandling local_50c;
  __shared_ptr local_508 [36];
  SpaceHandling local_4e4;
  SpaceHandling local_4cc;
  __shared_ptr local_4b0 [36];
  SpaceHandling local_48c;
  SpaceHandling local_474;
  allocator<char> local_459;
  string local_458 [32];
  string local_438 [79];
  allocator<char> local_3e9;
  string local_3e8 [32];
  string local_3c8 [56];
  Parser local_390;
  SpaceHandling local_334;
  SpaceHandling local_31c;
  SpaceHandling local_304;
  SpaceHandling local_2ec;
  string local_2e8 [39];
  undefined1 local_2c1 [49];
  undefined1 local_290 [32];
  string local_270 [76];
  SpaceHandling local_224;
  SpaceHandling local_20c;
  SpaceHandling local_1f4;
  __shared_ptr local_1f0 [36];
  SpaceHandling local_1cc;
  __shared_ptr local_1c8 [16];
  string local_1b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_198;
  string local_188 [36];
  SpaceHandling local_164;
  SpaceHandling local_134;
  SpaceHandling local_104;
  SpaceHandling local_d4;
  string local_d0 [36];
  SpaceHandling local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  byte local_1d;
  
  if ((tokenize()::comment_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::comment_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::comment_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::comment_tok_abi_cxx11_);
  }
  if ((tokenize()::expr_open_regex_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::expr_open_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_open_regex_abi_cxx11_);
  }
  if ((tokenize()::block_open_regex_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::block_open_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_open_regex_abi_cxx11_);
  }
  if ((tokenize()::block_keyword_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::block_keyword_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_keyword_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_keyword_tok_abi_cxx11_);
  }
  if ((tokenize()::non_text_open_regex_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::non_text_open_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::non_text_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::non_text_open_regex_abi_cxx11_);
  }
  if ((tokenize()::expr_close_regex_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::expr_close_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_close_regex_abi_cxx11_);
  }
  if ((tokenize()::block_close_regex_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&tokenize()::block_close_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff700,
               (char *)in_stack_fffffffffffff6f8,
               (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_close_regex_abi_cxx11_);
  }
  local_1d = 0;
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::vector((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
            *)0x33a8ca);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x33a8d7);
  std::__cxx11::string::string((string *)&local_58);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffff6c0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff6c0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff6b8);
    if (!bVar1) {
      local_1d = 1;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x33d474);
      std::__cxx11::string::~string((string *)&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6d0);
      if ((local_1d & 1) == 0) {
        std::
        vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
        ::~vector((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                   *)in_stack_fffffffffffff6d0);
      }
      return in_RDI;
    }
    get_location(in_stack_fffffffffffff708);
    consumeTokenGroups(in_stack_fffffffffffff778,in_stack_fffffffffffff770,in_stack_fffffffffffff76c
                      );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6d0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6c8);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff6d0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      consumeTokenGroups(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                         in_stack_fffffffffffff76c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6d0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6c8);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6d0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        consumeTokenGroups(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                           in_stack_fffffffffffff76c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6d0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6c8);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6d0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_588 = *(undefined8 *)(in_RSI + 0x20);
          local_5b8._40_8_ = *(undefined8 *)(in_RSI + 0x18);
          bVar1 = std::
                  regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
                             in_stack_fffffffffffff6d0,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             in_stack_fffffffffffff6c8,
                             (match_flag_type)((ulong)in_stack_fffffffffffff6c0 >> 0x20));
          in_stack_fffffffffffff76c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff76c);
          if (bVar1) {
            in_stack_fffffffffffff760 =
                 (string *)
                 std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::position(in_stack_fffffffffffff6d0,(size_type)in_stack_fffffffffffff6c8);
            if (in_stack_fffffffffffff760 == (string *)0x0) {
              std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](in_stack_fffffffffffff6d0,(size_type)in_stack_fffffffffffff6c8);
              bVar1 = std::__cxx11::operator!=
                                ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffff6c0,
                                 (value_type *)in_stack_fffffffffffff6b8);
              if (bVar1) {
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar5,"Internal error: Expected a comment");
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar5,"Missing end of comment tag");
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::position(in_stack_fffffffffffff6d0,(size_type)in_stack_fffffffffffff6c8);
            local_5c8 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)in_stack_fffffffffffff6c8,
                                            (difference_type)in_stack_fffffffffffff6c0);
            local_5c0 = *(undefined8 *)(in_RSI + 0x20);
            in_stack_fffffffffffff728 = &local_5c9;
            local_5b8.it._M_current = local_5c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6e0._M_current,in_stack_fffffffffffff6f0,
                       in_stack_fffffffffffff6e8,
                       (allocator<char> *)in_stack_fffffffffffff6d8._M_current);
            in_stack_fffffffffffff720 = &local_58;
            in_stack_fffffffffffff718 = &local_5b8;
            std::__cxx11::string::operator=
                      ((string *)in_stack_fffffffffffff720,(string *)in_stack_fffffffffffff718);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffff718);
            std::allocator<char>::~allocator(&local_5c9);
            *(char **)(in_RSI + 0x20) = local_5b8.it._M_current;
            local_5e4 = 0;
            local_5e8 = 0;
            std::
            make_unique<minja::TextTemplateToken,minja::Location&,minja::SpaceHandling,minja::SpaceHandling,std::__cxx11::string&>
                      (in_stack_fffffffffffff6f8,
                       (SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                       (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6e0._M_current);
            std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
            unique_ptr<minja::TextTemplateToken,std::default_delete<minja::TextTemplateToken>,void>
                      ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)in_stack_fffffffffffff6d0,
                       (unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>
                        *)in_stack_fffffffffffff6c8);
            std::
            vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
            ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                         *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
            std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
            std::
            unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
          }
          else {
            local_619._9_8_ = *(undefined8 *)(in_RSI + 0x20);
            local_619._1_8_ = *(size_type *)(in_RSI + 0x18);
            in_stack_fffffffffffff708 = (Parser *)local_619;
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6e0._M_current,in_stack_fffffffffffff6f0,
                       in_stack_fffffffffffff6e8,
                       (allocator<char> *)in_stack_fffffffffffff6d8._M_current);
            in_stack_fffffffffffff700 = &local_58;
            in_stack_fffffffffffff6f8 = (Location *)(local_619 + 0x11);
            std::__cxx11::string::operator=
                      ((string *)in_stack_fffffffffffff700,(string *)in_stack_fffffffffffff6f8);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffff6f8);
            std::allocator<char>::~allocator((allocator<char> *)local_619);
            *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x18);
            std::
            make_unique<minja::TextTemplateToken,minja::Location&,minja::SpaceHandling,minja::SpaceHandling,std::__cxx11::string&>
                      (in_stack_fffffffffffff6f8,
                       (SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                       (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6e0._M_current);
            in_stack_fffffffffffff6f0._M_current = local_628;
            std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
            unique_ptr<minja::TextTemplateToken,std::default_delete<minja::TextTemplateToken>,void>
                      ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)in_stack_fffffffffffff6d0,
                       (unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>
                        *)in_stack_fffffffffffff6c8);
            std::
            vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
            ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                         *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
            std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
            std::
            unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::TextTemplateToken,_std::default_delete<minja::TextTemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_38,1);
          local_164 = parsePreSpace(in_stack_fffffffffffff6b8,(string *)0x33af87);
          std::__cxx11::string::string(local_188);
          local_198 = &local_38;
          consumeToken(in_stack_fffffffffffff758,
                       (regex *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                       (SpaceHandling)((ulong)in_stack_fffffffffffff748 >> 0x20));
          std::__cxx11::string::operator=(local_188,local_1b8);
          bVar2 = std::__cxx11::string::empty();
          std::__cxx11::string::~string(local_1b8);
          if ((bVar2 & 1) != 0) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"Expected block keyword");
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar1 = std::operator==(in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
          if (bVar1) {
            parseExpression(in_stack_fffffffffffff788,SUB41(in_stack_fffffffffffff784 >> 0x18,0));
            bVar1 = std::__shared_ptr::operator_cast_to_bool(local_1c8);
            if (!bVar1) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar5,"Expected condition in if block");
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_1cc = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                  ((anon_class_16_2_ee9a8eb6 *)in_stack_fffffffffffff6f0._M_current)
            ;
            std::
            make_unique<minja::IfTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                      (in_stack_fffffffffffff6f8,
                       (SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                       (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6e0._M_current);
            std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
            unique_ptr<minja::IfTemplateToken,std::default_delete<minja::IfTemplateToken>,void>
                      ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)in_stack_fffffffffffff6d0,
                       (unique_ptr<minja::IfTemplateToken,_std::default_delete<minja::IfTemplateToken>_>
                        *)in_stack_fffffffffffff6c8);
            std::
            vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
            ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                         *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
            std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
            std::unique_ptr<minja::IfTemplateToken,_std::default_delete<minja::IfTemplateToken>_>::
            ~unique_ptr((unique_ptr<minja::IfTemplateToken,_std::default_delete<minja::IfTemplateToken>_>
                         *)in_stack_fffffffffffff6c0);
            std::shared_ptr<minja::Expression>::~shared_ptr
                      ((shared_ptr<minja::Expression> *)0x33b22d);
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
            if (bVar1) {
              parseExpression(in_stack_fffffffffffff788,SUB41(in_stack_fffffffffffff784 >> 0x18,0));
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_1f0);
              if (!bVar1) {
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar5,"Expected condition in elif block");
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              local_1f4 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                    ((anon_class_16_2_ee9a8eb6 *)
                                     in_stack_fffffffffffff6f0._M_current);
              std::
              make_unique<minja::ElifTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                        (in_stack_fffffffffffff6f8,
                         (SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                         (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                         (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6e0._M_current);
              std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
              unique_ptr<minja::ElifTemplateToken,std::default_delete<minja::ElifTemplateToken>,void>
                        ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)in_stack_fffffffffffff6d0,
                         (unique_ptr<minja::ElifTemplateToken,_std::default_delete<minja::ElifTemplateToken>_>
                          *)in_stack_fffffffffffff6c8);
              std::
              vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
              ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                           *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
              std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
              ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           *)in_stack_fffffffffffff6c0);
              std::
              unique_ptr<minja::ElifTemplateToken,_std::default_delete<minja::ElifTemplateToken>_>::
              ~unique_ptr((unique_ptr<minja::ElifTemplateToken,_std::default_delete<minja::ElifTemplateToken>_>
                           *)in_stack_fffffffffffff6c0);
              std::shared_ptr<minja::Expression>::~shared_ptr
                        ((shared_ptr<minja::Expression> *)0x33b3f3);
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
              if (bVar1) {
                local_20c = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                      ((anon_class_16_2_ee9a8eb6 *)
                                       in_stack_fffffffffffff6f0._M_current);
                std::
                make_unique<minja::ElseTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                          ((Location *)in_stack_fffffffffffff6e8._M_current,
                           (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                           (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
                unique_ptr<minja::ElseTemplateToken,std::default_delete<minja::ElseTemplateToken>,void>
                          ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)in_stack_fffffffffffff6d0,
                           (unique_ptr<minja::ElseTemplateToken,_std::default_delete<minja::ElseTemplateToken>_>
                            *)in_stack_fffffffffffff6c8);
                std::
                vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                             *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
                std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)in_stack_fffffffffffff6c0);
                std::
                unique_ptr<minja::ElseTemplateToken,_std::default_delete<minja::ElseTemplateToken>_>
                ::~unique_ptr((unique_ptr<minja::ElseTemplateToken,_std::default_delete<minja::ElseTemplateToken>_>
                               *)in_stack_fffffffffffff6c0);
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8)
                ;
                if (bVar1) {
                  local_224 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                        ((anon_class_16_2_ee9a8eb6 *)
                                         in_stack_fffffffffffff6f0._M_current);
                  std::
                  make_unique<minja::EndIfTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                            ((Location *)in_stack_fffffffffffff6e8._M_current,
                             (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                             (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                  std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
                  unique_ptr<minja::EndIfTemplateToken,std::default_delete<minja::EndIfTemplateToken>,void>
                            ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)in_stack_fffffffffffff6d0,
                             (unique_ptr<minja::EndIfTemplateToken,_std::default_delete<minja::EndIfTemplateToken>_>
                              *)in_stack_fffffffffffff6c8);
                  std::
                  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                  ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                               *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
                  std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)in_stack_fffffffffffff6c0);
                  std::
                  unique_ptr<minja::EndIfTemplateToken,_std::default_delete<minja::EndIfTemplateToken>_>
                  ::~unique_ptr((unique_ptr<minja::EndIfTemplateToken,_std::default_delete<minja::EndIfTemplateToken>_>
                                 *)in_stack_fffffffffffff6c0);
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                          (char *)in_stack_fffffffffffff6b8);
                  if (bVar1) {
                    if ((tokenize()::recursive_tok_abi_cxx11_ == '\0') &&
                       (iVar3 = __cxa_guard_acquire(&tokenize()::recursive_tok_abi_cxx11_),
                       iVar3 != 0)) {
                      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                      basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                  in_stack_fffffffffffff700,(char *)in_stack_fffffffffffff6f8,
                                  (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
                      __cxa_atexit(std::__cxx11::
                                   basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                   ~basic_regex,&tokenize()::recursive_tok_abi_cxx11_,&__dso_handle)
                      ;
                      __cxa_guard_release(&tokenize()::recursive_tok_abi_cxx11_);
                    }
                    if ((tokenize()::if_tok_abi_cxx11_ == '\0') &&
                       (iVar3 = __cxa_guard_acquire(&tokenize()::if_tok_abi_cxx11_), iVar3 != 0)) {
                      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                      basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                  in_stack_fffffffffffff700,(char *)in_stack_fffffffffffff6f8,
                                  (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
                      __cxa_atexit(std::__cxx11::
                                   basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                   ~basic_regex,&tokenize()::if_tok_abi_cxx11_,&__dso_handle);
                      __cxa_guard_release(&tokenize()::if_tok_abi_cxx11_);
                    }
                    parseVarNames_abi_cxx11_
                              ((Parser *)
                               CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928));
                    if ((tokenize()::in_tok_abi_cxx11_ == '\0') &&
                       (iVar3 = __cxa_guard_acquire(&tokenize()::in_tok_abi_cxx11_), iVar3 != 0)) {
                      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                      basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                  in_stack_fffffffffffff700,(char *)in_stack_fffffffffffff6f8,
                                  (flag_type)((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
                      __cxa_atexit(std::__cxx11::
                                   basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                   ~basic_regex,&tokenize()::in_tok_abi_cxx11_,&__dso_handle);
                      __cxa_guard_release(&tokenize()::in_tok_abi_cxx11_);
                    }
                    consumeToken(in_stack_fffffffffffff758,
                                 (regex *)CONCAT17(in_stack_fffffffffffff757,
                                                   in_stack_fffffffffffff750),
                                 (SpaceHandling)((ulong)in_stack_fffffffffffff748 >> 0x20));
                    bVar2 = std::__cxx11::string::empty();
                    std::__cxx11::string::~string(local_270);
                    if ((bVar2 & 1) != 0) {
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar5,"Expected \'in\' keyword in for block");
                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    parseExpression(in_stack_fffffffffffff788,
                                    SUB41(in_stack_fffffffffffff784 >> 0x18,0));
                    bVar1 = std::__shared_ptr::operator_cast_to_bool
                                      ((__shared_ptr *)(local_290 + 0x10));
                    if (!bVar1) {
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar5,"Expected iterable in for block");
                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::shared_ptr<minja::Expression>::shared_ptr
                              ((shared_ptr<minja::Expression> *)0x33b967);
                    consumeToken(in_stack_fffffffffffff758,
                                 (regex *)CONCAT17(in_stack_fffffffffffff757,
                                                   in_stack_fffffffffffff750),
                                 (SpaceHandling)((ulong)in_stack_fffffffffffff748 >> 0x20));
                    bVar2 = std::__cxx11::string::empty();
                    std::__cxx11::string::~string((string *)(local_2c1 + 0x11));
                    if (((bVar2 ^ 0xff) & 1) != 0) {
                      parseExpression(in_stack_fffffffffffff788,
                                      SUB41(in_stack_fffffffffffff784 >> 0x18,0));
                      std::shared_ptr<minja::Expression>::operator=
                                ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff6c0,
                                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6b8);
                      std::shared_ptr<minja::Expression>::~shared_ptr
                                ((shared_ptr<minja::Expression> *)0x33b9f8);
                    }
                    consumeToken(in_stack_fffffffffffff758,
                                 (regex *)CONCAT17(in_stack_fffffffffffff757,
                                                   in_stack_fffffffffffff750),
                                 (SpaceHandling)((ulong)in_stack_fffffffffffff748 >> 0x20));
                    bVar2 = std::__cxx11::string::empty();
                    std::__cxx11::string::~string(local_2e8);
                    local_2c1[0] = (_Alloc_hider)(bVar2 ^ 1);
                    local_2ec = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                          ((anon_class_16_2_ee9a8eb6 *)
                                           in_stack_fffffffffffff6f0._M_current);
                    in_stack_fffffffffffff6c0 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c1;
                    in_stack_fffffffffffff6b8 = (Parser *)local_290;
                    std::
                    make_unique<minja::ForTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,bool&>
                              ((Location *)in_stack_fffffffffffff708,
                               (SpaceHandling *)in_stack_fffffffffffff700,
                               (SpaceHandling *)in_stack_fffffffffffff6f8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff6f0._M_current,
                               (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6e8._M_current
                               ,(shared_ptr<minja::Expression> *)in_stack_fffffffffffff720,
                               (bool *)in_stack_fffffffffffff728);
                    std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                    ::
                    unique_ptr<minja::ForTemplateToken,std::default_delete<minja::ForTemplateToken>,void>
                              ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)in_stack_fffffffffffff6d0,
                               (unique_ptr<minja::ForTemplateToken,_std::default_delete<minja::ForTemplateToken>_>
                                *)in_stack_fffffffffffff6c8);
                    std::
                    vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                    ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                 *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8
                               );
                    std::
                    unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                    ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)in_stack_fffffffffffff6c0);
                    std::
                    unique_ptr<minja::ForTemplateToken,_std::default_delete<minja::ForTemplateToken>_>
                    ::~unique_ptr((unique_ptr<minja::ForTemplateToken,_std::default_delete<minja::ForTemplateToken>_>
                                   *)in_stack_fffffffffffff6c0);
                    std::shared_ptr<minja::Expression>::~shared_ptr
                              ((shared_ptr<minja::Expression> *)0x33bb3f);
                    std::shared_ptr<minja::Expression>::~shared_ptr
                              ((shared_ptr<minja::Expression> *)0x33bb4c);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6d0);
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                            (char *)in_stack_fffffffffffff6b8);
                    if (bVar1) {
                      local_304 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                            ((anon_class_16_2_ee9a8eb6 *)
                                             in_stack_fffffffffffff6f0._M_current);
                      std::
                      make_unique<minja::EndForTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                ((Location *)in_stack_fffffffffffff6e8._M_current,
                                 (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                                 (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                      std::
                      unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
                      unique_ptr<minja::EndForTemplateToken,std::default_delete<minja::EndForTemplateToken>,void>
                                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                  *)in_stack_fffffffffffff6d0,
                                 (unique_ptr<minja::EndForTemplateToken,_std::default_delete<minja::EndForTemplateToken>_>
                                  *)in_stack_fffffffffffff6c8);
                      std::
                      vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                      ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                   *)in_stack_fffffffffffff6c0,
                                  (value_type *)in_stack_fffffffffffff6b8);
                      std::
                      unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                      ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                   *)in_stack_fffffffffffff6c0);
                      std::
                      unique_ptr<minja::EndForTemplateToken,_std::default_delete<minja::EndForTemplateToken>_>
                      ::~unique_ptr((unique_ptr<minja::EndForTemplateToken,_std::default_delete<minja::EndForTemplateToken>_>
                                     *)in_stack_fffffffffffff6c0);
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                              (char *)in_stack_fffffffffffff6b8);
                      if (bVar1) {
                        local_31c = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                              ((anon_class_16_2_ee9a8eb6 *)
                                               in_stack_fffffffffffff6f0._M_current);
                        std::
                        make_unique<minja::GenerationTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                  ((Location *)in_stack_fffffffffffff6e8._M_current,
                                   (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                                   (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                        std::
                        unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
                        unique_ptr<minja::GenerationTemplateToken,std::default_delete<minja::GenerationTemplateToken>,void>
                                  ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                    *)in_stack_fffffffffffff6d0,
                                   (unique_ptr<minja::GenerationTemplateToken,_std::default_delete<minja::GenerationTemplateToken>_>
                                    *)in_stack_fffffffffffff6c8);
                        std::
                        vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                        ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                     *)in_stack_fffffffffffff6c0,
                                    (value_type *)in_stack_fffffffffffff6b8);
                        std::
                        unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                       *)in_stack_fffffffffffff6c0);
                        std::
                        unique_ptr<minja::GenerationTemplateToken,_std::default_delete<minja::GenerationTemplateToken>_>
                        ::~unique_ptr((unique_ptr<minja::GenerationTemplateToken,_std::default_delete<minja::GenerationTemplateToken>_>
                                       *)in_stack_fffffffffffff6c0);
                      }
                      else {
                        bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                (char *)in_stack_fffffffffffff6b8);
                        if (bVar1) {
                          local_334 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                ((anon_class_16_2_ee9a8eb6 *)
                                                 in_stack_fffffffffffff6f0._M_current);
                          std::
                          make_unique<minja::EndGenerationTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                    ((Location *)in_stack_fffffffffffff6e8._M_current,
                                     (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                                     (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                          std::
                          unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                          ::
                          unique_ptr<minja::EndGenerationTemplateToken,std::default_delete<minja::EndGenerationTemplateToken>,void>
                                    ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      *)in_stack_fffffffffffff6d0,
                                     (unique_ptr<minja::EndGenerationTemplateToken,_std::default_delete<minja::EndGenerationTemplateToken>_>
                                      *)in_stack_fffffffffffff6c8);
                          std::
                          vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                          ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                       *)in_stack_fffffffffffff6c0,
                                      (value_type *)in_stack_fffffffffffff6b8);
                          std::
                          unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                         *)in_stack_fffffffffffff6c0);
                          std::
                          unique_ptr<minja::EndGenerationTemplateToken,_std::default_delete<minja::EndGenerationTemplateToken>_>
                          ::~unique_ptr((unique_ptr<minja::EndGenerationTemplateToken,_std::default_delete<minja::EndGenerationTemplateToken>_>
                                         *)in_stack_fffffffffffff6c0);
                        }
                        else {
                          bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                  (char *)in_stack_fffffffffffff6b8);
                          if (bVar1) {
                            if ((tokenize()::namespaced_var_regex_abi_cxx11_ == '\0') &&
                               (iVar3 = __cxa_guard_acquire(&tokenize()::
                                                             namespaced_var_regex_abi_cxx11_),
                               iVar3 != 0)) {
                              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                              basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                          in_stack_fffffffffffff700,
                                          (char *)in_stack_fffffffffffff6f8,
                                          (flag_type)
                                          ((ulong)in_stack_fffffffffffff6f0._M_current >> 0x20));
                              __cxa_atexit(std::__cxx11::
                                           basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                                           ~basic_regex,&tokenize()::namespaced_var_regex_abi_cxx11_
                                           ,&__dso_handle);
                              __cxa_guard_release(&tokenize()::namespaced_var_regex_abi_cxx11_);
                            }
                            std::__cxx11::string::string((string *)&local_390.options);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)0x33bf16);
                            std::shared_ptr<minja::Expression>::shared_ptr
                                      ((shared_ptr<minja::Expression> *)0x33bf23);
                            consumeTokenGroups(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                                               in_stack_fffffffffffff76c);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffff6d0,
                                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffff6c8);
                            bVar1 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)in_stack_fffffffffffff6d0);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffff6d0);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              parseVarNames_abi_cxx11_
                                        ((Parser *)
                                         CONCAT17(in_stack_fffffffffffff92f,
                                                  in_stack_fffffffffffff928));
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)in_stack_fffffffffffff6d0,
                                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)in_stack_fffffffffffff6c8);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffff6d0);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_fffffffffffff700,(char *)in_stack_fffffffffffff6f8
                                         ,(allocator<char> *)in_stack_fffffffffffff6f0._M_current);
                              consumeToken((Parser *)
                                           CONCAT44(in_stack_fffffffffffff76c,
                                                    in_stack_fffffffffffff768),
                                           in_stack_fffffffffffff760,
                                           (SpaceHandling)((ulong)in_stack_fffffffffffff758 >> 0x20)
                                          );
                              bVar2 = std::__cxx11::string::empty();
                              std::__cxx11::string::~string(local_438);
                              std::__cxx11::string::~string(local_458);
                              std::allocator<char>::~allocator(&local_459);
                              if (((bVar2 ^ 0xff) & 1) != 0) {
                                parseExpression(in_stack_fffffffffffff788,
                                                SUB41(in_stack_fffffffffffff784 >> 0x18,0));
                                std::shared_ptr<minja::Expression>::operator=
                                          ((shared_ptr<minja::Expression> *)
                                           in_stack_fffffffffffff6c0,
                                           (shared_ptr<minja::Expression> *)
                                           in_stack_fffffffffffff6b8);
                                std::shared_ptr<minja::Expression>::~shared_ptr
                                          ((shared_ptr<minja::Expression> *)0x33c349);
                                bVar1 = std::__shared_ptr::operator_cast_to_bool
                                                  ((__shared_ptr *)&local_390);
                                if (!bVar1) {
                                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar5,"Expected value in set block");
                                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                              }
                            }
                            else {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](&local_38,1);
                              std::__cxx11::string::operator=
                                        ((string *)&local_390.options,(string *)pvVar4);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](&local_38,2);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_fffffffffffff700,(char *)in_stack_fffffffffffff6f8
                                         ,(allocator<char> *)in_stack_fffffffffffff6f0._M_current);
                              consumeToken((Parser *)
                                           CONCAT44(in_stack_fffffffffffff76c,
                                                    in_stack_fffffffffffff768),
                                           in_stack_fffffffffffff760,
                                           (SpaceHandling)((ulong)in_stack_fffffffffffff758 >> 0x20)
                                          );
                              bVar2 = std::__cxx11::string::empty();
                              std::__cxx11::string::~string(local_3c8);
                              std::__cxx11::string::~string(local_3e8);
                              std::allocator<char>::~allocator(&local_3e9);
                              if ((bVar2 & 1) != 0) {
                                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar5,"Expected equals sign in set block");
                                __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              parseExpression(in_stack_fffffffffffff788,
                                              SUB41(in_stack_fffffffffffff784 >> 0x18,0));
                              std::shared_ptr<minja::Expression>::operator=
                                        ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff6c0,
                                         (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6b8)
                              ;
                              std::shared_ptr<minja::Expression>::~shared_ptr
                                        ((shared_ptr<minja::Expression> *)0x33c1a4);
                              bVar1 = std::__shared_ptr::operator_cast_to_bool
                                                ((__shared_ptr *)&local_390);
                              if (!bVar1) {
                                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar5,"Expected value in set block");
                                __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                            }
                            local_474 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                  ((anon_class_16_2_ee9a8eb6 *)
                                                   in_stack_fffffffffffff6f0._M_current);
                            in_stack_fffffffffffff6b8 = &local_390;
                            std::
                            make_unique<minja::SetTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                                      ((Location *)in_stack_fffffffffffff708,
                                       (SpaceHandling *)in_stack_fffffffffffff700,
                                       (SpaceHandling *)in_stack_fffffffffffff6f8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff6f0._M_current,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_fffffffffffff6e8._M_current,
                                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffff720);
                            std::
                            unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                            ::
                            unique_ptr<minja::SetTemplateToken,std::default_delete<minja::SetTemplateToken>,void>
                                      ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                        *)in_stack_fffffffffffff6d0,
                                       (unique_ptr<minja::SetTemplateToken,_std::default_delete<minja::SetTemplateToken>_>
                                        *)in_stack_fffffffffffff6c8);
                            std::
                            vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                            ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                         *)in_stack_fffffffffffff6c0,
                                        (value_type *)in_stack_fffffffffffff6b8);
                            std::
                            unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                           *)in_stack_fffffffffffff6c0);
                            std::
                            unique_ptr<minja::SetTemplateToken,_std::default_delete<minja::SetTemplateToken>_>
                            ::~unique_ptr((unique_ptr<minja::SetTemplateToken,_std::default_delete<minja::SetTemplateToken>_>
                                           *)in_stack_fffffffffffff6c0);
                            std::shared_ptr<minja::Expression>::~shared_ptr
                                      ((shared_ptr<minja::Expression> *)0x33c4db);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffff6d0);
                            std::__cxx11::string::~string((string *)&local_390.options);
                          }
                          else {
                            bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                    (char *)in_stack_fffffffffffff6b8);
                            if (bVar1) {
                              local_48c = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                    ((anon_class_16_2_ee9a8eb6 *)
                                                     in_stack_fffffffffffff6f0._M_current);
                              std::
                              make_unique<minja::EndSetTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                        ((Location *)in_stack_fffffffffffff6e8._M_current,
                                         (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                                         (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                              std::
                              unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                              ::
                              unique_ptr<minja::EndSetTemplateToken,std::default_delete<minja::EndSetTemplateToken>,void>
                                        ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                          *)in_stack_fffffffffffff6d0,
                                         (unique_ptr<minja::EndSetTemplateToken,_std::default_delete<minja::EndSetTemplateToken>_>
                                          *)in_stack_fffffffffffff6c8);
                              std::
                              vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                              ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                           *)in_stack_fffffffffffff6c0,
                                          (value_type *)in_stack_fffffffffffff6b8);
                              std::
                              unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                             *)in_stack_fffffffffffff6c0);
                              std::
                              unique_ptr<minja::EndSetTemplateToken,_std::default_delete<minja::EndSetTemplateToken>_>
                              ::~unique_ptr((unique_ptr<minja::EndSetTemplateToken,_std::default_delete<minja::EndSetTemplateToken>_>
                                             *)in_stack_fffffffffffff6c0);
                            }
                            else {
                              bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                      (char *)in_stack_fffffffffffff6b8);
                              if (bVar1) {
                                parseIdentifier(in_stack_fffffffffffff718);
                                bVar1 = std::__shared_ptr::operator_cast_to_bool(local_4b0);
                                if (!bVar1) {
                                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar5,"Expected macro name in macro block");
                                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                parseParameters_abi_cxx11_(in_stack_fffffffffffff968);
                                local_4cc = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                      ((anon_class_16_2_ee9a8eb6 *)
                                                       in_stack_fffffffffffff6f0._M_current);
                                std::
                                make_unique<minja::MacroTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>>
                                          (in_stack_fffffffffffff6f8,
                                           (SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                                           (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                                           (shared_ptr<minja::VariableExpr> *)
                                           in_stack_fffffffffffff6e0._M_current,
                                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                                            *)in_stack_fffffffffffff6d8._M_current);
                                std::
                                unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                                ::
                                unique_ptr<minja::MacroTemplateToken,std::default_delete<minja::MacroTemplateToken>,void>
                                          ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                            *)in_stack_fffffffffffff6d0,
                                           (unique_ptr<minja::MacroTemplateToken,_std::default_delete<minja::MacroTemplateToken>_>
                                            *)in_stack_fffffffffffff6c8);
                                std::
                                vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                             *)in_stack_fffffffffffff6c0,
                                            (value_type *)in_stack_fffffffffffff6b8);
                                std::
                                unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                               *)in_stack_fffffffffffff6c0);
                                std::
                                unique_ptr<minja::MacroTemplateToken,_std::default_delete<minja::MacroTemplateToken>_>
                                ::~unique_ptr((unique_ptr<minja::MacroTemplateToken,_std::default_delete<minja::MacroTemplateToken>_>
                                               *)in_stack_fffffffffffff6c0);
                                std::
                                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                                           *)in_stack_fffffffffffff6d0);
                                std::shared_ptr<minja::VariableExpr>::~shared_ptr
                                          ((shared_ptr<minja::VariableExpr> *)0x33c7ea);
                              }
                              else {
                                bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                        (char *)in_stack_fffffffffffff6b8);
                                if (bVar1) {
                                  local_4e4 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                        ((anon_class_16_2_ee9a8eb6 *)
                                                         in_stack_fffffffffffff6f0._M_current);
                                  std::
                                  make_unique<minja::EndMacroTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                            ((Location *)in_stack_fffffffffffff6e8._M_current,
                                             (SpaceHandling *)in_stack_fffffffffffff6e0._M_current,
                                             (SpaceHandling *)in_stack_fffffffffffff6d8._M_current);
                                  std::
                                  unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                                  ::
                                  unique_ptr<minja::EndMacroTemplateToken,std::default_delete<minja::EndMacroTemplateToken>,void>
                                            ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                              *)in_stack_fffffffffffff6d0,
                                             (unique_ptr<minja::EndMacroTemplateToken,_std::default_delete<minja::EndMacroTemplateToken>_>
                                              *)in_stack_fffffffffffff6c8);
                                  std::
                                  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                  ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                               *)in_stack_fffffffffffff6c0,
                                              (value_type *)in_stack_fffffffffffff6b8);
                                  std::
                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                  ::~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                 *)in_stack_fffffffffffff6c0);
                                  std::
                                  unique_ptr<minja::EndMacroTemplateToken,_std::default_delete<minja::EndMacroTemplateToken>_>
                                  ::~unique_ptr((unique_ptr<minja::EndMacroTemplateToken,_std::default_delete<minja::EndMacroTemplateToken>_>
                                                 *)in_stack_fffffffffffff6c0);
                                }
                                else {
                                  bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                          (char *)in_stack_fffffffffffff6b8);
                                  if (bVar1) {
                                    parseExpression(in_stack_fffffffffffff788,
                                                    SUB41(in_stack_fffffffffffff784 >> 0x18,0));
                                    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_508);
                                    if (!bVar1) {
                                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                (prVar5,"Expected expression in filter block");
                                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                    local_50c = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                          ((anon_class_16_2_ee9a8eb6 *)
                                                           in_stack_fffffffffffff6f0._M_current);
                                    std::
                                    make_unique<minja::FilterTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                                              (in_stack_fffffffffffff6f8,
                                               (SpaceHandling *)in_stack_fffffffffffff6f0._M_current
                                               ,(SpaceHandling *)
                                                in_stack_fffffffffffff6e8._M_current,
                                               (shared_ptr<minja::Expression> *)
                                               in_stack_fffffffffffff6e0._M_current);
                                    std::
                                    unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                                    ::
                                    unique_ptr<minja::FilterTemplateToken,std::default_delete<minja::FilterTemplateToken>,void>
                                              ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                *)in_stack_fffffffffffff6d0,
                                               (unique_ptr<minja::FilterTemplateToken,_std::default_delete<minja::FilterTemplateToken>_>
                                                *)in_stack_fffffffffffff6c8);
                                    std::
                                    vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                    ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                                 *)in_stack_fffffffffffff6c0,
                                                (value_type *)in_stack_fffffffffffff6b8);
                                    std::
                                    unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                    ::~unique_ptr((
                                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                    std::
                                    unique_ptr<minja::FilterTemplateToken,_std::default_delete<minja::FilterTemplateToken>_>
                                    ::~unique_ptr((
                                                  unique_ptr<minja::FilterTemplateToken,_std::default_delete<minja::FilterTemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                    std::shared_ptr<minja::Expression>::~shared_ptr
                                              ((shared_ptr<minja::Expression> *)0x33cac1);
                                  }
                                  else {
                                    bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                            (char *)in_stack_fffffffffffff6b8);
                                    if (bVar1) {
                                      local_524 = tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                            ((anon_class_16_2_ee9a8eb6 *)
                                                             in_stack_fffffffffffff6f0._M_current);
                                      std::
                                      make_unique<minja::EndFilterTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&>
                                                ((Location *)in_stack_fffffffffffff6e8._M_current,
                                                 (SpaceHandling *)
                                                 in_stack_fffffffffffff6e0._M_current,
                                                 (SpaceHandling *)
                                                 in_stack_fffffffffffff6d8._M_current);
                                      in_stack_fffffffffffff788 = (Parser *)(local_548 + 0x18);
                                      std::
                                      unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                                      ::
                                      unique_ptr<minja::EndFilterTemplateToken,std::default_delete<minja::EndFilterTemplateToken>,void>
                                                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff6d0,
                                                 (unique_ptr<minja::EndFilterTemplateToken,_std::default_delete<minja::EndFilterTemplateToken>_>
                                                  *)in_stack_fffffffffffff6c8);
                                      std::
                                      vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                      ::push_back((
                                                  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                                  *)in_stack_fffffffffffff6c0,
                                                  (value_type *)in_stack_fffffffffffff6b8);
                                      std::
                                      unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      ::~unique_ptr((
                                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                      std::
                                      unique_ptr<minja::EndFilterTemplateToken,_std::default_delete<minja::EndFilterTemplateToken>_>
                                      ::~unique_ptr((
                                                  unique_ptr<minja::EndFilterTemplateToken,_std::default_delete<minja::EndFilterTemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                    }
                                    else {
                                      bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                              (char *)in_stack_fffffffffffff6b8);
                                      if ((!bVar1) &&
                                         (bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                                  (char *)in_stack_fffffffffffff6b8)
                                         , !bVar1)) {
                                        local_579 = 1;
                                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::operator+((char *)in_stack_fffffffffffff708,
                                                       in_stack_fffffffffffff700);
                                        std::runtime_error::runtime_error(prVar5,local_578);
                                        local_579 = 0;
                                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      in_stack_fffffffffffff784 =
                                           tokenize::anon_class_16_2_ee9a8eb6::operator()
                                                     ((anon_class_16_2_ee9a8eb6 *)
                                                      in_stack_fffffffffffff6f0._M_current);
                                      local_548._12_4_ = in_stack_fffffffffffff784;
                                      bVar1 = std::operator==(in_stack_fffffffffffff6c0,
                                                              (char *)in_stack_fffffffffffff6b8);
                                      local_554 = (uint)!bVar1;
                                      std::
                                      make_unique<minja::LoopControlTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,minja::LoopControlType>
                                                (in_stack_fffffffffffff6f8,
                                                 (SpaceHandling *)
                                                 in_stack_fffffffffffff6f0._M_current,
                                                 (SpaceHandling *)
                                                 in_stack_fffffffffffff6e8._M_current,
                                                 (LoopControlType *)
                                                 in_stack_fffffffffffff6e0._M_current);
                                      in_stack_fffffffffffff778 = (Parser *)local_548;
                                      std::
                                      unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>
                                      ::
                                      unique_ptr<minja::LoopControlTemplateToken,std::default_delete<minja::LoopControlTemplateToken>,void>
                                                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff6d0,
                                                 (unique_ptr<minja::LoopControlTemplateToken,_std::default_delete<minja::LoopControlTemplateToken>_>
                                                  *)in_stack_fffffffffffff6c8);
                                      std::
                                      vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                      ::push_back((
                                                  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                                                  *)in_stack_fffffffffffff6c0,
                                                  (value_type *)in_stack_fffffffffffff6b8);
                                      std::
                                      unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      ::~unique_ptr((
                                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                      std::
                                      unique_ptr<minja::LoopControlTemplateToken,_std::default_delete<minja::LoopControlTemplateToken>_>
                                      ::~unique_ptr((
                                                  unique_ptr<minja::LoopControlTemplateToken,_std::default_delete<minja::LoopControlTemplateToken>_>
                                                  *)in_stack_fffffffffffff6c0);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string(local_188);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        local_104 = parsePreSpace(in_stack_fffffffffffff6b8,(string *)0x33acde);
        parseExpression(in_stack_fffffffffffff788,SUB41(in_stack_fffffffffffff784 >> 0x18,0));
        consumeTokenGroups(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                           in_stack_fffffffffffff76c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6d0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6c8);
        in_stack_fffffffffffff92f =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6d0);
        if ((in_stack_fffffffffffff92f & 1) != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected closing expression tag");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        local_134 = parsePostSpace(in_stack_fffffffffffff6b8,(string *)0x33ae1c);
        std::
        make_unique<minja::ExpressionTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::shared_ptr<minja::Expression>>
                  (in_stack_fffffffffffff6f8,(SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                   (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                   (shared_ptr<minja::Expression> *)in_stack_fffffffffffff6e0._M_current);
        std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
        unique_ptr<minja::ExpressionTemplateToken,std::default_delete<minja::ExpressionTemplateToken>,void>
                  ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   in_stack_fffffffffffff6d0,
                   (unique_ptr<minja::ExpressionTemplateToken,_std::default_delete<minja::ExpressionTemplateToken>_>
                    *)in_stack_fffffffffffff6c8);
        std::
        vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
        ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                     *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
        std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
        ~unique_ptr((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    in_stack_fffffffffffff6c0);
        std::
        unique_ptr<minja::ExpressionTemplateToken,_std::default_delete<minja::ExpressionTemplateToken>_>
        ::~unique_ptr((unique_ptr<minja::ExpressionTemplateToken,_std::default_delete<minja::ExpressionTemplateToken>_>
                       *)in_stack_fffffffffffff6c0);
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x33aebd);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,1);
      local_ac = parsePreSpace(in_stack_fffffffffffff6b8,(string *)0x33a9b2);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,2);
      std::__cxx11::string::string(local_d0,(string *)pvVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,3);
      local_d4 = parsePostSpace(in_stack_fffffffffffff6b8,(string *)0x33aa0f);
      std::
      make_unique<minja::CommentTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::__cxx11::string&>
                (in_stack_fffffffffffff6f8,(SpaceHandling *)in_stack_fffffffffffff6f0._M_current,
                 (SpaceHandling *)in_stack_fffffffffffff6e8._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6e0._M_current);
      std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>::
      unique_ptr<minja::CommentTemplateToken,std::default_delete<minja::CommentTemplateToken>,void>
                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 in_stack_fffffffffffff6d0,
                 (unique_ptr<minja::CommentTemplateToken,_std::default_delete<minja::CommentTemplateToken>_>
                  *)in_stack_fffffffffffff6c8);
      std::
      vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
      ::push_back((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
                   *)in_stack_fffffffffffff6c0,(value_type *)in_stack_fffffffffffff6b8);
      std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::~unique_ptr
                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 in_stack_fffffffffffff6c0);
      std::
      unique_ptr<minja::CommentTemplateToken,_std::default_delete<minja::CommentTemplateToken>_>::
      ~unique_ptr((unique_ptr<minja::CommentTemplateToken,_std::default_delete<minja::CommentTemplateToken>_>
                   *)in_stack_fffffffffffff6c0);
      std::__cxx11::string::~string(local_d0);
    }
    Location::~Location((Location *)0x33d338);
  } while( true );
}

Assistant:

TemplateTokenVector tokenize() {
      static std::regex comment_tok(R"(\{#([-~]?)([\s\S]*?)([-~]?)#\})");
      static std::regex expr_open_regex(R"(\{\{([-~])?)");
      static std::regex block_open_regex(R"(^\{%([-~])?\s*)");
      static std::regex block_keyword_tok(R"((if|else|elif|endif|for|endfor|generation|endgeneration|set|endset|block|endblock|macro|endmacro|filter|endfilter|break|continue)\b)");
      static std::regex non_text_open_regex(R"(\{\{|\{%|\{#)");
      static std::regex expr_close_regex(R"(\s*([-~])?\}\})");
      static std::regex block_close_regex(R"(\s*([-~])?%\})");

      TemplateTokenVector tokens;
      std::vector<std::string> group;
      std::string text;
      std::smatch match;

      try {
        while (it != end) {
          auto location = get_location();

          if (!(group = consumeTokenGroups(comment_tok, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto content = group[2];
            auto post_space = parsePostSpace(group[3]);
            tokens.push_back(std::make_unique<CommentTemplateToken>(location, pre_space, post_space, content));
          } else if (!(group = consumeTokenGroups(expr_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto expr = parseExpression();

            if ((group = consumeTokenGroups(expr_close_regex)).empty()) {
              throw std::runtime_error("Expected closing expression tag");
            }

            auto post_space = parsePostSpace(group[1]);
            tokens.push_back(std::make_unique<ExpressionTemplateToken>(location, pre_space, post_space, std::move(expr)));
          } else if (!(group = consumeTokenGroups(block_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);

            std::string keyword;

            auto parseBlockClose = [&]() -> SpaceHandling {
              if ((group = consumeTokenGroups(block_close_regex)).empty()) throw std::runtime_error("Expected closing block tag");
              return parsePostSpace(group[1]);
            };

            if ((keyword = consumeToken(block_keyword_tok)).empty()) throw std::runtime_error("Expected block keyword");

            if (keyword == "if") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in if block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<IfTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "elif") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in elif block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElifTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "else") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElseTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endif") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndIfTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "for") {
              static std::regex recursive_tok(R"(recursive\b)");
              static std::regex if_tok(R"(if\b)");

              auto varnames = parseVarNames();
              static std::regex in_tok(R"(in\b)");
              if (consumeToken(in_tok).empty()) throw std::runtime_error("Expected 'in' keyword in for block");
              auto iterable = parseExpression(/* allow_if_expr = */ false);
              if (!iterable) throw std::runtime_error("Expected iterable in for block");

              std::shared_ptr<Expression> condition;
              if (!consumeToken(if_tok).empty()) {
                condition = parseExpression();
              }
              auto recursive = !consumeToken(recursive_tok).empty();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ForTemplateToken>(location, pre_space, post_space, std::move(varnames), std::move(iterable), std::move(condition), recursive));
            } else if (keyword == "endfor") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndForTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "generation") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<GenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endgeneration") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndGenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "set") {
              static std::regex namespaced_var_regex(R"((\w+)\s*\.\s*(\w+))");

              std::string ns;
              std::vector<std::string> var_names;
              std::shared_ptr<Expression> value;
              if (!(group = consumeTokenGroups(namespaced_var_regex)).empty()) {
                ns = group[1];
                var_names.push_back(group[2]);

                if (consumeToken("=").empty()) throw std::runtime_error("Expected equals sign in set block");

                value = parseExpression();
                if (!value) throw std::runtime_error("Expected value in set block");
              } else {
                var_names = parseVarNames();

                if (!consumeToken("=").empty()) {
                  value = parseExpression();
                  if (!value) throw std::runtime_error("Expected value in set block");
                }
              }
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<SetTemplateToken>(location, pre_space, post_space, ns, var_names, std::move(value)));
            } else if (keyword == "endset") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndSetTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "macro") {
              auto macroname = parseIdentifier();
              if (!macroname) throw std::runtime_error("Expected macro name in macro block");
              auto params = parseParameters();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<MacroTemplateToken>(location, pre_space, post_space, std::move(macroname), std::move(params)));
            } else if (keyword == "endmacro") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndMacroTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "filter") {
              auto filter = parseExpression();
              if (!filter) throw std::runtime_error("Expected expression in filter block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<FilterTemplateToken>(location, pre_space, post_space, std::move(filter)));
            } else if (keyword == "endfilter") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndFilterTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "break" || keyword == "continue") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<LoopControlTemplateToken>(location, pre_space, post_space, keyword == "break" ? LoopControlType::Break : LoopControlType::Continue));
            } else {
              throw std::runtime_error("Unexpected block: " + keyword);
            }
          } else if (std::regex_search(it, end, match, non_text_open_regex)) {
            if (!match.position()) {
                if (match[0] != "{#")
                    throw std::runtime_error("Internal error: Expected a comment");
                throw std::runtime_error("Missing end of comment tag");
            }
            auto text_end = it + match.position();
            text = std::string(it, text_end);
            it = text_end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          } else {
            text = std::string(it, end);
            it = end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          }
        }
        return tokens;
      } catch (const std::exception & e) {
        throw std::runtime_error(e.what() + error_location_suffix(*template_str, std::distance(start, it)));
      }
    }